

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

char * QTest::tcIncidentType2String(IncidentTypes type)

{
  IncidentTypes type_local;
  char *local_8;
  
  switch(type) {
  case Skip:
    local_8 = "SKIP";
    break;
  case Pass:
    local_8 = "PASS";
    break;
  case XFail:
    local_8 = "XFAIL";
    break;
  case Fail:
    local_8 = "FAIL!";
    break;
  case XPass:
    local_8 = "XPASS";
    break;
  case BlacklistedPass:
    local_8 = "BPASS";
    break;
  case BlacklistedFail:
    local_8 = "BFAIL";
    break;
  case BlacklistedXPass:
    local_8 = "BXPASS";
    break;
  case BlacklistedXFail:
    local_8 = "BXFAIL";
    break;
  default:
    local_8 = "??????";
  }
  return local_8;
}

Assistant:

static const char *tcIncidentType2String(QAbstractTestLogger::IncidentTypes type)
    {
        switch (type) {
        case QAbstractTestLogger::Skip:
            return "SKIP";
        case QAbstractTestLogger::Pass:
            return "PASS";
        case QAbstractTestLogger::XFail:
            return "XFAIL";
        case QAbstractTestLogger::Fail:
            return "FAIL!";
        case QAbstractTestLogger::XPass:
            return "XPASS";
        case QAbstractTestLogger::BlacklistedPass:
            return "BPASS";
        case QAbstractTestLogger::BlacklistedFail:
            return "BFAIL";
        case QAbstractTestLogger::BlacklistedXPass:
            return "BXPASS";
        case QAbstractTestLogger::BlacklistedXFail:
            return "BXFAIL";
        }
        return "??????";
    }